

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

sqlite3_stmt * rtreeCheckPrepare(RtreeCheck *pCheck,char *zFmt,...)

{
  char in_AL;
  int iVar1;
  char *zSql;
  undefined8 in_RCX;
  undefined8 in_RDX;
  sqlite3_stmt *psVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  sqlite3_stmt *pRet;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  sqlite3_stmt *local_40;
  __va_list_tag local_38;
  long local_20;
  
  local_38.reg_save_area = local_f8;
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Da;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = (sqlite3_stmt *)0x0;
  local_38.gp_offset = 0x10;
  local_38.fp_offset = 0x30;
  local_38.overflow_arg_area = &stack0x00000008;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  zSql = sqlite3_vmprintf(zFmt,&local_38);
  if (pCheck->rc == 0) {
    if (zSql != (char *)0x0) {
      iVar1 = sqlite3LockAndPrepare(pCheck->db,zSql,-1,0x80,(Vdbe *)0x0,&local_40,(char **)0x0);
      pCheck->rc = iVar1;
      psVar2 = local_40;
      goto LAB_001f569a;
    }
    pCheck->rc = 7;
  }
  psVar2 = (sqlite3_stmt *)0x0;
LAB_001f569a:
  sqlite3_free(zSql);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return psVar2;
  }
  __stack_chk_fail();
}

Assistant:

static sqlite3_stmt *rtreeCheckPrepare(
  RtreeCheck *pCheck,             /* RtreeCheck object */
  const char *zFmt, ...           /* Format string and trailing args */
){
  va_list ap;
  char *z;
  sqlite3_stmt *pRet = 0;

  va_start(ap, zFmt);
  z = sqlite3_vmprintf(zFmt, ap);

  if( pCheck->rc==SQLITE_OK ){
    if( z==0 ){
      pCheck->rc = SQLITE_NOMEM;
    }else{
      pCheck->rc = sqlite3_prepare_v2(pCheck->db, z, -1, &pRet, 0);
    }
  }

  sqlite3_free(z);
  va_end(ap);
  return pRet;
}